

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::CommandBuffer>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  char *pcVar1;
  bool bVar2;
  deUint32 queueFamilyIndex_;
  iterator beg;
  iterator end;
  VkAllocationCallbacks *pVVar3;
  PlatformInterface *vkp_;
  DeviceInterface *vkd_;
  VkDevice device_;
  ProgramCollection<vk::ProgramBinary> *programBinaries_;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  reference ppVVar7;
  char **value;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  char *local_510;
  string local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  uint local_4a0;
  int local_49c;
  deUint32 nullNdx;
  undefined1 local_318 [8];
  vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
  scopedHandles;
  Resources res;
  MessageBuilder local_2d0;
  undefined1 local_150 [8];
  Environment objEnv;
  AllocationCallbackRecorder recorder;
  DeterministicFailAllocator objAllocator;
  VkResult local_58 [2];
  VkResult result;
  allocator<vk::VkCommandBuffer_s_*> local_41;
  undefined1 local_40 [8];
  vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> handles;
  deUint32 numPassingAllocs;
  bool expectNullHandles;
  Context *context_local;
  Parameters params_local;
  
  context_local = (Context *)params;
  params_local = (Parameters)__return_storage_ptr__;
  handles.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       api::(anonymous_namespace)::isNullHandleOnAllocationFailure<vk::VkCommandBuffer_s*>(context);
  handles.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::allocator<vk::VkCommandBuffer_s_*>::allocator(&local_41);
  std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
            ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)local_40,4
             ,&local_41);
  std::allocator<vk::VkCommandBuffer_s_*>::~allocator(&local_41);
  local_58[0] = VK_NOT_READY;
  do {
    if (4 < (uint)handles.
                  super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_007cf413:
      local_49c = 0;
LAB_007cf41d:
      std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::~vector
                ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
                 local_40);
      if (local_49c == 0) {
        if ((uint)handles.
                  super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
          bVar2 = api::(anonymous_namespace)::isPooledObject<vk::VkCommandBuffer_s*>();
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_558,
                       "Not validated: pooled objects didn\'t seem to use host memory",&local_559);
            tcu::TestStatus::pass(__return_storage_ptr__,&local_558);
            std::__cxx11::string::~string((string *)&local_558);
            std::allocator<char>::~allocator(&local_559);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_580,"Allocation callbacks not called",&local_581);
            tcu::TestStatus::TestStatus
                      (__return_storage_ptr__,QP_TEST_RESULT_QUALITY_WARNING,&local_580);
            std::__cxx11::string::~string((string *)&local_580);
            std::allocator<char>::~allocator(&local_581);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"Ok",&local_5a9);
          tcu::TestStatus::pass(__return_storage_ptr__,&local_5a8);
          std::__cxx11::string::~string((string *)&local_5a8);
          std::allocator<char>::~allocator(&local_5a9);
        }
      }
      return __return_storage_ptr__;
    }
    beg = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::begin
                    ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
                     local_40);
    end = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::end
                    ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
                     local_40);
    ::vk::ValidateQueryBits::
    fillBits<__gnu_cxx::__normal_iterator<vk::VkCommandBuffer_s**,std::vector<vk::VkCommandBuffer_s*,std::allocator<vk::VkCommandBuffer_s*>>>>
              ((__normal_iterator<vk::VkCommandBuffer_s_**,_std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>_>
                )beg._M_current,
               (__normal_iterator<vk::VkCommandBuffer_s_**,_std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>_>
                )end._M_current,0xde);
    pVVar3 = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last,pVVar3,MODE_DO_NOT_COUNT,0);
    pVVar3 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&recorder.m_records.m_last);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,pVVar3,0x80);
    vkp_ = Context::getPlatformInterface(context);
    vkd_ = Context::getDeviceInterface(context);
    device_ = Context::getDevice(context);
    queueFamilyIndex_ = Context::getUniversalQueueFamilyIndex(context);
    programBinaries_ = Context::getBinaryCollection(context);
    pVVar3 = ::vk::AllocationCallbacks::getCallbacks
                       ((AllocationCallbacks *)&objEnv.maxResourceConsumers);
    Environment::Environment
              ((Environment *)local_150,vkp_,vkd_,device_,queueFamilyIndex_,programBinaries_,pVVar3,
               4);
    pTVar4 = Context::getTestContext(context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_2d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [18])"Trying to create ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,&allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::CommandBuffer>
                                ::numObjects);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" objects with ");
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(uint *)&handles.
                                        super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])" allocation");
    pcVar1 = ",\n\t\t";
    if ((uint)handles.
              super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != 1) {
      pcVar1 = "%s<%s";
    }
    res.commandPool.object.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)(pcVar1 + 4);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char **)&res.commandPool.object.
                                         super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                         deleter.m_allocator);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])" passing");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2d0);
    CommandBuffer::Resources::Resources
              ((Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Environment *)local_150,
               (Parameters *)&context_local);
    ::vk::DeterministicFailAllocator::reset
              ((DeterministicFailAllocator *)&recorder.m_records.m_last,MODE_COUNT_AND_FAIL,
               (uint)handles.
                     super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    CommandBuffer::createMultiple
              ((vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
                *)local_318,(Environment *)local_150,
               (Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Parameters *)&context_local,
               (vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)local_40
               ,local_58);
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
               *)local_318);
    CommandBuffer::Resources::~Resources
              ((Resources *)
               &scopedHandles.
                super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::VkCommandBuffer_s_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_58[0] == VK_SUCCESS) {
      pTVar4 = Context::getTestContext(context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&nullNdx,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&nullNdx,
                          (char (*) [40])"Construction of all objects succeeded! ");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&nullNdx);
      local_49c = 2;
    }
    else {
      if ((handles.
           super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        for (local_4a0 = (uint)handles.
                               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage; local_4a0 < 4;
            local_4a0 = local_4a0 + 1) {
          ppVVar7 = std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::
                    operator[]((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                                *)local_40,(ulong)local_4a0);
          if (*ppVVar7 != (value_type)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4c0,"Some object handles weren\'t set to NULL",&local_4c1);
            tcu::TestStatus::fail(__return_storage_ptr__,&local_4c0);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::allocator<char>::~allocator(&local_4c1);
            local_49c = 1;
            goto LAB_007cf3af;
          }
        }
      }
      if (local_58[0] == VK_ERROR_OUT_OF_HOST_MEMORY) {
        pTVar4 = Context::getTestContext(context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        bVar2 = ::vk::validateAndLog
                          (pTVar5,(AllocationCallbackRecorder *)&objEnv.maxResourceConsumers,0);
        if (bVar2) {
          local_49c = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_530,"Invalid allocation callback",&local_531);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_530);
          std::__cxx11::string::~string((string *)&local_530);
          std::allocator<char>::~allocator(&local_531);
          local_49c = 1;
        }
      }
      else {
        local_510 = ::vk::getResultName(local_58[0]);
        de::toString<char_const*>(&local_508,(de *)&local_510,value);
        std::operator+(&local_4e8,"Got invalid error code: ",&local_508);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_4e8);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_508);
        local_49c = 1;
      }
    }
LAB_007cf3af:
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
              ((AllocationCallbackRecorder *)&objEnv.maxResourceConsumers);
    ::vk::DeterministicFailAllocator::~DeterministicFailAllocator
              ((DeterministicFailAllocator *)&recorder.m_records.m_last);
    if (local_49c != 0) {
      if (local_49c != 2) goto LAB_007cf41d;
      goto LAB_007cf413;
    }
    handles.super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)handles.
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}